

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  Nonnull<char_*> pcVar2;
  size_t in_R9;
  ulong uVar3;
  string_view format;
  char local_98 [32];
  ulong local_78;
  long local_70;
  long local_68;
  Nonnull<char_*> local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  
  lVar1 = *(long *)(*(long *)(*(long *)this + 0x20) + 0x10);
  uVar3 = (ulong)*(ushort *)(lVar1 + 2);
  pcVar2 = numbers_internal::FastIntToBuffer(*(int32_t *)(*(long *)this + 4),local_98);
  local_68 = (long)pcVar2 - (long)local_98;
  local_58 = **(undefined8 **)(this + 8);
  uStack_50 = (*(undefined8 **)(this + 8))[1];
  local_40 = **(undefined8 **)(this + 0x10);
  local_48 = (*(undefined8 **)(this + 0x10))[1];
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  format._M_str = (char *)&local_78;
  format._M_len =
       (size_t)"\"$0\" extension field $1 is expected to have field name \"$2\", not \"$3\".";
  local_78 = uVar3;
  local_70 = ~uVar3 + lVar1;
  local_60 = local_98;
  substitute_internal::SubstituteAndAppendArray
            ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x46,format,
             (Nullable<const_absl::string_view_*>)0x4,in_R9);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}